

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

string * cs_impl::runtime_cs_ext::get_import_path_abi_cxx11_(void)

{
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(cs::current_process + 0x58));
  return in_RDI;
}

Assistant:

string get_import_path()
		{
			return current_process->import_path;
		}